

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QVariant * __thiscall
QMap<QByteArray,_QVariant>::operator[](QMap<QByteArray,_QVariant> *this,QByteArray *key)

{
  bool bVar1;
  QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
  *pQVar2;
  pointer ppVar3;
  value_type *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QByteArray,_QVariant>_>,_bool> pVar4;
  iterator i;
  QMap<QByteArray,_QVariant> copy;
  map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>
  *in_stack_ffffffffffffff28;
  QVariant *pQVar5;
  QMap<QByteArray,_QVariant> *in_stack_ffffffffffffff30;
  map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>
  *this_00;
  pair<const_QByteArray,_QVariant> *this_01;
  _Self local_88;
  _Self local_80;
  undefined8 local_78;
  _Base_ptr local_70;
  undefined1 local_68;
  map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>
  local_60;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = 0xaaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff30->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffff30,(QMap<QByteArray,_QVariant> *)in_stack_ffffffffffffff28);
  }
  else {
    memset(&local_78,0,8);
    QMap((QMap<QByteArray,_QVariant> *)0x38fae3);
  }
  detach(in_stack_ffffffffffffff30);
  local_80._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
                *)0x38fb03);
  local_80._M_node =
       (_Base_ptr)
       std::
       map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>
       ::find(in_stack_ffffffffffffff28,(key_type *)0x38fb14);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
                *)0x38fb23);
  local_88._M_node =
       (_Base_ptr)
       std::
       map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>
       ::end(in_stack_ffffffffffffff28);
  bVar1 = std::operator==(&local_80,&local_88);
  if (bVar1) {
    pQVar2 = QtPrivate::
             QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
             ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
                           *)0x38fb56);
    this_01 = (pair<const_QByteArray,_QVariant> *)&pQVar2->m;
    this_00 = &local_60;
    QVariant::QVariant((QVariant *)0x38fb78);
    std::pair<const_QByteArray,_QVariant>::pair<QVariant,_true>
              (this_01,(QByteArray *)this_00,(QVariant *)in_RSI);
    pVar4 = std::
            map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>
            ::insert(this_00,in_RSI);
    local_80._M_node = (_Base_ptr)pVar4.first._M_node;
    local_68 = pVar4.second;
    local_70 = local_80._M_node;
    std::pair<const_QByteArray,_QVariant>::~pair(in_RSI);
    QVariant::~QVariant((QVariant *)&local_60);
  }
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_QByteArray,_QVariant>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_QByteArray,_QVariant>_> *)0x38fbe9);
  pQVar5 = &ppVar3->second;
  ~QMap((QMap<QByteArray,_QVariant> *)0x38fbfb);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar5;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }